

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<const_Catch::IConfig> * __thiscall
Catch::Ptr<const_Catch::IConfig>::operator=
          (Ptr<const_Catch::IConfig> *this,Ptr<const_Catch::IConfig> *other)

{
  IConfig *pIVar1;
  Ptr<const_Catch::IConfig> local_20;
  
  pIVar1 = other->m_p;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
  }
  local_20 = (Ptr<const_Catch::IConfig>)this->m_p;
  this->m_p = pIVar1;
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = (Ptr const& other) {
			Ptr temp(other);
			swap(temp);
			return *this;
		}